

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O0

double sawWave(double x)

{
  double dVar1;
  double temp1;
  double offset;
  double x_local;
  
  if (x < 0.0) {
    dVar1 = floor(ABS(x));
    temp1 = x - (-1.0 - dVar1);
  }
  else {
    temp1 = frac(x);
  }
  if (0.5 <= temp1) {
    temp1 = 1.0 - temp1;
  }
  x_local = temp1 * 2.0;
  return x_local;
}

Assistant:

double sawWave(double x)
{
   double offset, temp1;

   if(x >= 0.0) offset = frac(x);
   else
   {
      temp1  = -1.0 - floor(fabs(x));
      offset = x - temp1;
   }
   if(offset >= 0.5) return 2.0 * (1.0 -  offset);
   else              return 2.0 * offset;
}